

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Stress::FenceSyncCase::iterate(FenceSyncCase *this)

{
  size_type *psVar1;
  Random *rnd;
  vector<__GLsync_*,_std::allocator<__GLsync_*>_> *this_00;
  ostringstream *poVar2;
  uint uVar3;
  TestLog *log;
  pointer pp_Var4;
  bool bVar5;
  GLenum GVar6;
  GLenum err;
  long *plVar7;
  undefined8 *puVar8;
  GLsync p_Var9;
  pointer pp_Var10;
  TestError *pTVar11;
  long *plVar12;
  TestLog *pTVar13;
  pointer pp_Var14;
  IterateResult IVar15;
  TestLog TVar16;
  qpTestLog *pqVar17;
  char *pcVar18;
  int iVar19;
  long lVar20;
  float fVar21;
  ScopedLogSection section;
  vector<float,_std::allocator<float>_> vertices;
  string header;
  ScopedLogSection local_268;
  long local_260;
  TestLog local_258;
  long lStack_250;
  vector<float,_std::allocator<float>_> local_248;
  string local_230;
  qpTestLog **local_210;
  long local_208;
  qpTestLog *local_200 [2];
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [112];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar19 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar19 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0x1c325b8);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_1e0 = *plVar12;
    lStack_1d8 = plVar7[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar12;
    local_1f0 = (long *)*plVar7;
  }
  local_1e8 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  pTVar13 = (TestLog *)(plVar7 + 2);
  if ((TestLog *)*plVar7 == pTVar13) {
    local_258.m_log = pTVar13->m_log;
    lStack_250 = plVar7[3];
    local_268.m_log = &local_258;
  }
  else {
    local_258.m_log = pTVar13->m_log;
    local_268.m_log = (TestLog *)*plVar7;
  }
  local_260 = plVar7[1];
  *plVar7 = (long)pTVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  TVar16.m_log = (qpTestLog *)0xf;
  if (local_268.m_log != &local_258) {
    TVar16.m_log = local_258.m_log;
  }
  if (TVar16.m_log < (qpTestLog *)(local_208 + local_260)) {
    pqVar17 = (qpTestLog *)0xf;
    if (local_210 != local_200) {
      pqVar17 = local_200[0];
    }
    if (pqVar17 < (qpTestLog *)(local_208 + local_260)) goto LAB_013ac2fa;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_268.m_log);
  }
  else {
LAB_013ac2fa:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_210);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_230.field_2._M_allocated_capacity = *psVar1;
    local_230.field_2._8_8_ = puVar8[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar1;
    local_230._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_230._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_210 != local_200) {
    operator_delete(local_210,(ulong)((long)&local_200[0]->flags + 1));
  }
  if (local_268.m_log != &local_258) {
    operator_delete(local_268.m_log,(ulong)((long)&(local_258.m_log)->flags + 1));
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection(&local_268,log,&local_230,&local_230);
  (this->super_CallLogWrapper).m_enableLog = true;
  if (this->m_program == (ShaderProgram *)0x0) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar11,(char *)0x0,"m_program",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
               ,0xaa);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnable(0xb71);
  glwClearColor(0.3,0.3,0.3,1.0);
  glwClearDepthf(1.0);
  glwClear(0x4100);
  glwEnableVertexAttribArray(0);
  iVar19 = *(int *)&(this->super_CallLogWrapper).field_0x14;
  std::vector<float,_std::allocator<float>_>::resize(&local_248,(long)(iVar19 * 0xc));
  rnd = &this->m_rnd;
  uVar3 = iVar19 * 3;
  if (0 < (int)uVar3) {
    lVar20 = 0;
    do {
      fVar21 = deRandom_getFloat(&rnd->m_rnd);
      iVar19 = (int)lVar20;
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar19] = fVar21 + fVar21 + -1.0;
      fVar21 = deRandom_getFloat(&rnd->m_rnd);
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar19 + 1] = fVar21 + fVar21 + -1.0;
      fVar21 = deRandom_getFloat(&rnd->m_rnd);
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar19 + 2] = fVar21 + 0.0;
      local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar19 + 3] = 1.0;
      lVar20 = lVar20 + 4;
    } while ((ulong)uVar3 << 2 != lVar20);
  }
  glwVertexAttribPointer
            (0,4,0x1406,'\0',0,
             local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  this_00 = &this->m_syncObjects;
  std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>::resize
            (this_00,(long)*(int *)&(this->super_CallLogWrapper).field_0x14);
  (this->super_CallLogWrapper).m_enableLog = false;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// NOT LOGGED: ",0xf);
  std::ostream::operator<<(poVar2,*(int *)&(this->super_CallLogWrapper).field_0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2," glDrawArrays and glFenceSync calls done here.",0x2e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (0 < *(int *)&(this->super_CallLogWrapper).field_0x14) {
    iVar19 = 0;
    lVar20 = 0;
    do {
      glwDrawArrays(4,iVar19,3);
      p_Var9 = glwFenceSync(0x9117,0);
      (this_00->super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar20] = p_Var9;
      GVar6 = glwGetError();
      glu::checkError(GVar6,"Sync object created",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                      ,0xc1);
      lVar20 = lVar20 + 1;
      iVar19 = iVar19 + 3;
    } while (lVar20 < *(int *)&(this->super_CallLogWrapper).field_0x14);
  }
  (this->super_CallLogWrapper).m_enableLog = true;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// Draws performed, sync objects created.",0x29);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<__GLsync**,std::vector<__GLsync*,std::allocator<__GLsync*>>>>
            (rnd,(__normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>
                  )(this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<__GLsync_**,_std::vector<__GLsync_*,_std::allocator<__GLsync_*>_>_>)
             (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  (this->super_CallLogWrapper).m_enableLog = false;
  if ((this->m_waitCommand & 1) == 0) {
    if ((this->m_waitCommand & 2) == 0) goto LAB_013ac79f;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// NOT LOGGED: ",0xf);
    std::ostream::operator<<(poVar2,*(int *)&(this->super_CallLogWrapper).field_0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2," glClientWaitSync calls done here.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// NOT LOGGED: ",0xf);
    std::ostream::operator<<(poVar2,*(int *)&(this->super_CallLogWrapper).field_0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2," glWaitSync calls done here.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
LAB_013ac79f:
  if (*(int *)&(this->super_CallLogWrapper).field_0x14 < 1) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    lVar20 = 0;
    do {
      if ((this->m_waitCommand & 1) == 0) {
        if ((this->m_waitCommand & 2) != 0) {
          GVar6 = glwClientWaitSync((this_00->
                                    super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>).
                                    _M_impl.super__Vector_impl_data._M_start[lVar20],0,100);
          err = glwGetError();
          glu::checkError(err,"glClientWaitSync called",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                          ,0xdc);
          if (2 < GVar6 - 0x911a) {
            if (GVar6 != 0x911d) {
              pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar11,"glClientWaitSync returned an unknown return value.",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                         ,0xe3);
              __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            poVar2 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"// glClientWaitSync returned GL_WAIT_FAILED",0x2b);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base(local_138);
            bVar5 = false;
          }
        }
      }
      else {
        glwWaitSync((this_00->super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20],0,0xffffffffffffffff);
        GVar6 = glwGetError();
        glu::checkError(GVar6,"glWaitSync called",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                        ,0xd7);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < *(int *)&(this->super_CallLogWrapper).field_0x14);
  }
  (this->super_CallLogWrapper).m_enableLog = true;
  glwFinish();
  (this->super_CallLogWrapper).m_enableLog = false;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// NOT LOGGED: ",0xf);
  std::ostream::operator<<(poVar2,*(int *)&(this->super_CallLogWrapper).field_0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2," glDeleteSync calls done here.",0x1e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  pp_Var10 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pp_Var14 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pp_Var14 - (long)pp_Var10) >> 3)) {
    lVar20 = 0;
    do {
      if (pp_Var10[lVar20] != (GLsync)0x0) {
        glwDeleteSync(pp_Var10[lVar20]);
        GVar6 = glwGetError();
        glu::checkError(GVar6,"Sync object deleted",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSyncTests.cpp"
                        ,0xf5);
      }
      lVar20 = lVar20 + 1;
      pp_Var10 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pp_Var14 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar20 < (int)((ulong)((long)pp_Var14 - (long)pp_Var10) >> 3));
  }
  (this->super_CallLogWrapper).m_enableLog = true;
  if ((pp_Var10 != pp_Var14) &&
     (pp_Var4 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
     pp_Var10 = (pointer)((long)pp_Var10 + ((long)pp_Var4 - (long)pp_Var14)), pp_Var4 != pp_Var10))
  {
    (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
    super__Vector_impl_data._M_finish = pp_Var10;
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// Test result: ",0x10);
  pcVar18 = "Failed!";
  if (bVar5) {
    pcVar18 = "Passed!";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,pcVar18,7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (bVar5) {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"// Sync objects created and deleted successfully.",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    uVar3 = this->m_iterNdx;
    this->m_iterNdx = uVar3 + 1;
    IVar15 = (IterateResult)(0x7ffffffe < uVar3);
  }
  else {
    IVar15 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  tcu::TestLog::endSection(local_268.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar15;
}

Assistant:

FenceSyncCase::IterateResult FenceSyncCase::iterate (void)
{
	TestLog&				log		= m_testCtx.getLog();
	std::vector<float>		vertices;
	bool					testOk	= true;

	std::string				header	= "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	tcu::ScopedLogSection	section	(log, header, header);

	enableLogging(true);

	TCU_CHECK		(m_program);
	glUseProgram	(m_program->getProgram());
	glEnable		(GL_DEPTH_TEST);
	glClearColor	(0.3f, 0.3f, 0.3f, 1.0f);
	glClearDepthf	(1.0f);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray	(0);
	generateVertices			(vertices, m_numSyncs, m_rnd);
	glVertexAttribPointer		(0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);
	m_syncObjects.resize		(m_numSyncs);

	// Perform draws and create sync objects

	enableLogging(false);
	log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glDrawArrays and glFenceSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < m_numSyncs; i++)
	{
		glDrawArrays(GL_TRIANGLES, i*3, 3);
		m_syncObjects[i] = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_CHECK_MSG("Sync object created");
	}
	enableLogging(true);
	log << TestLog::Message << "// Draws performed, sync objects created." << TestLog::EndMessage;

	// Wait for sync objects

	m_rnd.shuffle(m_syncObjects.begin(), m_syncObjects.end());

	enableLogging(false);
	if (m_waitCommand & COMMAND_WAIT_SYNC)
		log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glWaitSync calls done here." << TestLog::EndMessage;
	else if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
		log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glClientWaitSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < m_numSyncs; i++)
	{
		GLenum waitValue = 0;

		if (m_waitCommand & COMMAND_WAIT_SYNC)
		{
			glWaitSync(m_syncObjects[i], 0, GL_TIMEOUT_IGNORED);
			GLU_CHECK_MSG("glWaitSync called");
		}
		else if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
		{
			waitValue = glClientWaitSync(m_syncObjects[i], 0, 100);
			GLU_CHECK_MSG("glClientWaitSync called");
			switch (waitValue)
			{
				case GL_ALREADY_SIGNALED:	 break;
				case GL_TIMEOUT_EXPIRED:	 break;
				case GL_CONDITION_SATISFIED: break;
				case GL_WAIT_FAILED:		 log << TestLog::Message << "// glClientWaitSync returned GL_WAIT_FAILED"	<< TestLog::EndMessage; testOk = false; break;
				default:					 TCU_FAIL("glClientWaitSync returned an unknown return value.");
			}
		}
	}
	enableLogging(true);

	glFinish();

	// Delete sync objects

	enableLogging(false);
	log << TestLog::Message << "// NOT LOGGED: " << m_numSyncs << " glDeleteSync calls done here." << TestLog::EndMessage;

	for (int i = 0; i < (int)m_syncObjects.size(); i++)
	{
		if (m_syncObjects[i])
		{
			glDeleteSync(m_syncObjects[i]);
			GLU_CHECK_MSG("Sync object deleted");
		}
	}

	enableLogging(true);

	m_syncObjects.erase(m_syncObjects.begin(), m_syncObjects.end());

	// Evaluate test result

	log << TestLog::Message << "// Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "// Sync objects created and deleted successfully." << TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}